

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ThreadTest::GLES2Context::GLES2Context
          (GLES2Context *this,SharedPtr<tcu::ThreadUtil::Event> *event,
          SharedPtr<deqp::egl::GLES2ThreadTest::GLES2ResourceManager> *resourceManager_)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  SharedPtr<tcu::ThreadUtil::Event> local_20;
  
  local_20.m_ptr = event->m_ptr;
  local_20.m_state = event->m_state;
  if (local_20.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_20.m_state)->strongRefCount = (local_20.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_20.m_state)->weakRefCount = (local_20.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  tcu::ThreadUtil::Object::Object(&this->super_Object,"Context",&local_20);
  if (local_20.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_20.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_20.m_ptr = (Event *)0x0;
      (*(local_20.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_20.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_20.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_20.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__GLES2Context_0215ebc8;
  (this->resourceManager).m_ptr = resourceManager_->m_ptr;
  pSVar2 = resourceManager_->m_state;
  (this->resourceManager).m_state = pSVar2;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->resourceManager).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
  }
  this->display = (EGLDisplay)0x0;
  this->context = (EGLContext)0x0;
  (this->glExtensions).imageTargetTexture2D = (glEGLImageTargetTexture2DOESFunc)0x0;
  return;
}

Assistant:

GLES2Context::GLES2Context (SharedPtr<tcu::ThreadUtil::Event> event, SharedPtr<GLES2ResourceManager> resourceManager_)
	: tcu::ThreadUtil::Object	("Context", event)
	, resourceManager			(resourceManager_)
	, display					(EGL_NO_DISPLAY)
	, context					(EGL_NO_CONTEXT)
{
	glExtensions.imageTargetTexture2D = DE_NULL;
}